

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowTerminalType::~IfcFlowTerminalType(IfcFlowTerminalType *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28;
  *(undefined8 *)
   &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28 = 0x8afe60;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x10 = 0x8aff28;
  *(undefined8 *)
   &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 = 0x8afe88;
  *(undefined8 *)
   &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xc0 = 0x8afeb0;
  *(undefined8 *)
   &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x118 = 0x8afed8;
  *(undefined8 *)
   &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
    super_IfcElementType.field_0x170 = 0x8aff00;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
             super_IfcElementType.field_0x180;
  if (puVar1 != &this[-1].super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                 super_IfcElementType.field_0x190) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this_00,&PTR_construction_vtable_24__008afa30);
  operator_delete(this_00);
  return;
}

Assistant:

IfcFlowTerminalType() : Object("IfcFlowTerminalType") {}